

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void test_invoke_obj<int_const,true,int_C::*const&,D_const>
               (int *r,offset_in_C_to_int *param_2,D *param_3)

{
  test_context context;
  test_context context_00;
  test_context context_01;
  test_context context_02;
  test_context context_03;
  test_context context_04;
  test_context context_05;
  test_context context_06;
  int *piVar1;
  int *piVar2;
  undefined4 uStack_dc;
  undefined4 uStack_c4;
  undefined4 uStack_ac;
  undefined4 uStack_94;
  undefined4 uStack_7c;
  undefined4 uStack_64;
  undefined4 uStack_4c;
  undefined4 uStack_34;
  D *a1_local;
  offset_in_C_to_int *f_local;
  int *r_local;
  
  piVar1 = eggs::invoke<int_C::*const&,D_const>(param_2,param_3);
  piVar1 = addressof<int>(piVar1);
  piVar2 = addressof<int>(r);
  context._12_4_ = uStack_34;
  context.line = 0x7d;
  context.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context.expr = 
  "::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)";
  test_check(piVar1 == piVar2,context);
  piVar1 = eggs::invoke_r<int_const&&,int_C::*const&,D_const>(param_2,param_3);
  piVar1 = addressof<int>(piVar1);
  piVar2 = addressof<int>(r);
  context_00._12_4_ = uStack_4c;
  context_00.line = 0x7e;
  context_00.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_00.expr =
       "::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r)"
  ;
  test_check(piVar1 == piVar2,context_00);
  context_01._12_4_ = uStack_64;
  context_01.line = 0x7f;
  context_01.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_01.expr =
       "std::is_same<decltype(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value";
  test_check(true,context_01);
  context_02._12_4_ = uStack_7c;
  context_02.line = 0x80;
  context_02.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_02.expr =
       "std::is_same<decltype(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value"
  ;
  test_check(true,context_02);
  context_03._12_4_ = uStack_94;
  context_03.line = 0x81;
  context_03.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_03.expr =
       "std::is_same<decltype(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))), void>::value"
  ;
  test_check(true,context_03);
  context_04._12_4_ = uStack_ac;
  context_04.line = 0x82;
  context_04.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_04.expr = "noexcept(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow";
  test_check(true,context_04);
  context_05._12_4_ = uStack_c4;
  context_05.line = 0x83;
  context_05.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_05.expr =
       "noexcept(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow";
  test_check(true,context_05);
  context_06._12_4_ = uStack_dc;
  context_06.line = 0x84;
  context_06.file =
       "/workspace/llm4binary/github/license_c_cmakelists/eggs-cpp[P]invoke/test/invoke.cpp";
  context_06.expr =
       "noexcept(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow";
  test_check(true,context_06);
  return;
}

Assistant:

void test_invoke_obj(
    R&& r, std::integral_constant<bool, IsNothrow>,
    F&& f, A1&& a1)
{
    CHECK(::addressof(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(::addressof(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == ::addressof(r));
    CHECK(std::is_same<decltype(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))), R&&>::value);
    CHECK(std::is_same<decltype(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))), void>::value);
    CHECK(noexcept(eggs::invoke(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<R&&>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
    CHECK(noexcept(eggs::invoke_r<void>(std::forward<F>(f), std::forward<A1>(a1))) == IsNothrow);
}